

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int hd_context_init(nghttp2_hd_context *context,nghttp2_mem *mem)

{
  int rv;
  nghttp2_mem *mem_local;
  nghttp2_hd_context *context_local;
  
  context->mem = mem;
  context->bad = '\0';
  context->hd_table_bufsize_max = 0x1000;
  context_local._4_4_ = hd_ringbuf_init(&context->hd_table,context->hd_table_bufsize_max >> 5,mem);
  if (context_local._4_4_ == 0) {
    context->hd_table_bufsize = 0;
    context->next_seq = 0;
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

static int hd_context_init(nghttp2_hd_context *context, nghttp2_mem *mem) {
  int rv;
  context->mem = mem;
  context->bad = 0;
  context->hd_table_bufsize_max = NGHTTP2_HD_DEFAULT_MAX_BUFFER_SIZE;
  rv = hd_ringbuf_init(
      &context->hd_table,
      context->hd_table_bufsize_max / NGHTTP2_HD_ENTRY_OVERHEAD, mem);
  if (rv != 0) {
    return rv;
  }

  context->hd_table_bufsize = 0;
  context->next_seq = 0;

  return 0;
}